

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void readQuantizationTable(ifstream *inFile,Header *header)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  byte bVar7;
  uint i;
  long lVar8;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Reading DQT");
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar2 = std::istream::get();
  iVar3 = std::istream::get();
  iVar2 = iVar3 + iVar2 * 0x100 + -2;
  do {
    if (iVar2 < 1) {
      if (iVar2 != 0) {
        std::operator<<((ostream *)&std::cout,"Error -DQT invalid\n");
LAB_001029d8:
        header->valid = false;
      }
      return;
    }
    bVar1 = std::istream::get();
    bVar7 = bVar1 & 0xf;
    if ((bVar1 & 0xc) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"invaild quantizatio table ID:");
      poVar6 = std::operator<<(poVar6,bVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_001029d8;
    }
    header->quantizationTables[bVar7].set = true;
    lVar8 = 0;
    if ((bVar1 & 0xf0) == 0) {
      for (; lVar8 != 0x40; lVar8 = lVar8 + 1) {
        uVar4 = std::istream::get();
        header->quantizationTables[bVar7].table[""[lVar8]] = uVar4;
      }
      iVar3 = -0x41;
    }
    else {
      for (; lVar8 != 0x40; lVar8 = lVar8 + 1) {
        iVar3 = std::istream::get();
        iVar5 = std::istream::get();
        header->quantizationTables[bVar7].table[""[lVar8]] = iVar5 + iVar3 * 0x100;
      }
      iVar3 = -0x81;
    }
    iVar2 = iVar2 + iVar3;
  } while( true );
}

Assistant:

void readQuantizationTable(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading DQT" << std::endl;
	int length = (inFile.get() << 8) + inFile.get();
	length = length - 2;
	while (length > 0) {	
		byte tableInfo = inFile.get();
		byte tableSize = tableInfo >> 4;
		byte tableID = tableInfo & 0x0F;
		length = length - 1;

		//只能是 0 1 2 3 
		if (tableID > 3) {
			std::cout << "invaild quantizatio table ID:" << tableID << std::endl;
			header->valid = false;
			return;
		}

		header->quantizationTables[tableID].set = true;

		if (tableSize != 0) { //2bytes
			for (uint i = 0; i < 64; i++) {
				//文件中的数据是以zig_zag的顺序存储的，所以需要以zig_zag的顺序赋值。
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = (inFile.get() << 8) + inFile.get();
			}
			length = length - 128;
		} else {
			for (uint i = 0; i < 64; i++) {
				header->quantizationTables[tableID].table[ZIG_ZAG[i]] = inFile.get();
			}
			length = length - 64;
		}
	}

	if (length != 0) {
		std::cout << "Error -DQT invalid\n";
		header->valid = false;
	}
}